

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p5_pbev2.cc
# Opt level: O0

int pkcs5_pbe2_cipher_init
              (EVP_CIPHER_CTX *ctx,EVP_CIPHER *cipher,EVP_MD *pbkdf2_md,uint32_t iterations,
              char *pass,size_t pass_len,uint8_t *salt,size_t salt_len,uint8_t *iv,size_t iv_len,
              int enc)

{
  uint uVar1;
  int iVar2;
  bool local_99;
  uchar local_88 [4];
  int ret;
  uint8_t key [64];
  size_t pass_len_local;
  char *pass_local;
  uint32_t iterations_local;
  EVP_MD *pbkdf2_md_local;
  EVP_CIPHER *cipher_local;
  EVP_CIPHER_CTX *ctx_local;
  
  uVar1 = EVP_CIPHER_iv_length((EVP_CIPHER *)cipher);
  if (iv_len == uVar1) {
    iVar2 = EVP_CIPHER_key_length((EVP_CIPHER *)cipher);
    iVar2 = PKCS5_PBKDF2_HMAC(pass,(int)pass_len,salt,(int)salt_len,iterations,(EVP_MD *)pbkdf2_md,
                              iVar2,local_88);
    local_99 = false;
    if (iVar2 != 0) {
      iVar2 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)ctx,(EVP_CIPHER *)cipher,(ENGINE *)0x0,local_88,iv
                                ,enc);
      local_99 = iVar2 != 0;
    }
    ctx_local._4_4_ = (uint)local_99;
    OPENSSL_cleanse(local_88,0x40);
  }
  else {
    ERR_put_error(0x13,0,0x6b,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                  ,0x75);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int pkcs5_pbe2_cipher_init(EVP_CIPHER_CTX *ctx, const EVP_CIPHER *cipher,
                                  const EVP_MD *pbkdf2_md, uint32_t iterations,
                                  const char *pass, size_t pass_len,
                                  const uint8_t *salt, size_t salt_len,
                                  const uint8_t *iv, size_t iv_len, int enc) {
  if (iv_len != EVP_CIPHER_iv_length(cipher)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_ERROR_SETTING_CIPHER_PARAMS);
    return 0;
  }

  uint8_t key[EVP_MAX_KEY_LENGTH];
  int ret = PKCS5_PBKDF2_HMAC(pass, pass_len, salt, salt_len, iterations,
                              pbkdf2_md, EVP_CIPHER_key_length(cipher), key) &&
            EVP_CipherInit_ex(ctx, cipher, NULL /* engine */, key, iv, enc);
  OPENSSL_cleanse(key, EVP_MAX_KEY_LENGTH);
  return ret;
}